

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O3

int secp256r1sha256_sign
              (ptls_sign_certificate_t *_self,ptls_t *tls,ptls_async_job_t **async,
              uint16_t *selected_algorithm,ptls_buffer_t *outbuf,ptls_iovec_t input,
              uint16_t *algorithms,size_t num_algorithms)

{
  int iVar1;
  uECC_Curve curve;
  size_t sVar2;
  size_t body_size;
  uint8_t sig [64];
  undefined1 local_ca;
  undefined1 local_c9;
  uint8_t local_c8 [32];
  cf_sha256_context local_a8;
  
  if (num_algorithms != 0) {
    sVar2 = 0;
    do {
      if (algorithms[sVar2] == 0x403) {
        cf_sha256_init(&local_a8);
        cf_sha256_update(&local_a8,input.base,input.len);
        cf_sha256_digest_final(&local_a8,local_c8);
        (*ptls_clear_memory)(&local_a8,0x70);
        curve = uECC_secp256r1();
        uECC_sign((uint8_t *)(_self + 1),local_c8,0x20,(uint8_t *)&local_a8,curve);
        local_c9 = 0x30;
        iVar1 = ptls_buffer__do_pushv(outbuf,&local_c9,1);
        if (iVar1 == 0) {
          local_ca = 0xff;
          iVar1 = ptls_buffer__do_pushv(outbuf,&local_ca,1);
          if (iVar1 == 0) {
            sVar2 = outbuf->off;
            iVar1 = ptls_buffer_push_asn1_ubigint(outbuf,&local_a8,0x20);
            if ((iVar1 == 0) &&
               (iVar1 = ptls_buffer_push_asn1_ubigint(outbuf,local_a8.partial,0x20), iVar1 == 0)) {
              body_size = outbuf->off - sVar2;
              if (body_size < 0x80) {
                outbuf->base[sVar2 - 1] = (uint8_t)body_size;
              }
              else {
                iVar1 = ptls_buffer__adjust_asn1_blocksize(outbuf,body_size);
                if (iVar1 != 0) goto LAB_00113845;
              }
              *selected_algorithm = 0x403;
              iVar1 = 0;
            }
          }
        }
LAB_00113845:
        (*ptls_clear_memory)(local_c8,0x20);
        (*ptls_clear_memory)(&local_a8,0x40);
        return iVar1;
      }
      sVar2 = sVar2 + 1;
    } while (num_algorithms != sVar2);
  }
  return 0x28;
}

Assistant:

static int secp256r1sha256_sign(ptls_sign_certificate_t *_self, ptls_t *tls, ptls_async_job_t **async, uint16_t *selected_algorithm,
                                ptls_buffer_t *outbuf, ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_minicrypto_secp256r1sha256_sign_certificate_t *self = (ptls_minicrypto_secp256r1sha256_sign_certificate_t *)_self;
    uint8_t hash[32], sig[64];
    size_t i;
    int ret;

    /* check algorithm */
    for (i = 0; i != num_algorithms; ++i)
        if (algorithms[i] == PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256)
            break;
    if (i == num_algorithms)
        return PTLS_ALERT_HANDSHAKE_FAILURE;

    { /* calc hash */
        cf_sha256_context ctx;
        cf_sha256_init(&ctx);
        cf_sha256_update(&ctx, input.base, input.len);
        cf_sha256_digest_final(&ctx, hash);
        ptls_clear_memory(&ctx, sizeof(ctx));
    }

    /* sign */
    uECC_sign(self->key, hash, sizeof(hash), sig, uECC_secp256r1());

    /* encode using DER */
    ptls_buffer_push_asn1_sequence(outbuf, {
        if ((ret = ptls_buffer_push_asn1_ubigint(outbuf, sig, 32)) != 0)
            goto Exit;
        if ((ret = ptls_buffer_push_asn1_ubigint(outbuf, sig + 32, 32)) != 0)
            goto Exit;
    });

    *selected_algorithm = PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256;
    ret = 0;

Exit:
    ptls_clear_memory(hash, sizeof(hash));
    ptls_clear_memory(sig, sizeof(sig));
    return ret;
}